

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cabal.c
# Opt level: O2

void spell_bane(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int iVar1;
  
  if ((*(byte *)((long)vo + 0x181) & 2) == 0) {
    iVar1 = dice(level,2);
    iVar1 = iVar1 * 2;
  }
  else {
    iVar1 = dice(level,3);
    iVar1 = iVar1 * 3;
    act("Your mental assault tears at $N\'s ignorance!",ch,(void *)0x0,vo,3);
    act("$n\'s mental assault tears at your ignorance!",ch,(void *)0x0,vo,2);
    act("$n\'s mental assault tears at $N\'s ignorance!",ch,(void *)0x0,vo,1);
  }
  damage_new(ch,(CHAR_DATA *)vo,iVar1,(int)gsn_bane,0xc,true,false,0,1,"mental assault");
  return;
}

Assistant:

void spell_bane(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int damage;

	if (IS_SET(victim->act, PLR_IGNORANT))
	{
		damage = 3 * dice(level, 3);
		act("Your mental assault tears at $N's ignorance!", ch, 0, victim, TO_CHAR);
		act("$n's mental assault tears at your ignorance!", ch, 0, victim, TO_VICT);
		act("$n's mental assault tears at $N's ignorance!", ch, 0, victim, TO_NOTVICT);
	}
	else
	{
		damage = 2 * dice(level, 2);
	}

	damage_new(ch, victim, damage, gsn_bane, DAM_MENTAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "mental assault");
}